

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::append_empty<int,true>
          (ref<immutable::rrb_details::internal_node<int,_true>_> *to_set,uint32_t empty_height)

{
  internal_node<int,_true> *piVar1;
  uint uVar2;
  ref<immutable::rrb_details::internal_node<int,_true>_> empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> leaf;
  
  if (empty_height != 0) {
    leaf.ptr = internal_node_create<int,true>(1);
    if (leaf.ptr == (internal_node<int,_true> *)0x0) {
      empty.ptr = (internal_node<int,_true> *)0x0;
    }
    else {
      LOCK();
      ((leaf.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      LOCK();
      ((leaf.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((leaf.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      empty.ptr = leaf.ptr;
    }
    for (uVar2 = 1; uVar2 < empty_height; uVar2 = uVar2 + 1) {
      new_empty.ptr = internal_node_create<int,true>(1);
      if (new_empty.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((new_empty.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
      }
      piVar1 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&new_empty);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(piVar1->child,&empty);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&empty,&new_empty);
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&new_empty);
    }
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(to_set,&empty);
    piVar1 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&leaf);
    to_set = piVar1->child;
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&empty);
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&leaf);
  }
  return to_set;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* append_empty(ref<internal_node<T, atomic_ref_counting>>* to_set, uint32_t empty_height)
      {
      if (0 < empty_height)
        {
        ref<internal_node<T, atomic_ref_counting>> leaf = internal_node_create<T, atomic_ref_counting>(1);
        ref<internal_node<T, atomic_ref_counting>> empty = leaf;
        for (uint32_t i = 1; i < empty_height; i++)
          {
          ref<internal_node<T, atomic_ref_counting>> new_empty = internal_node_create<T, atomic_ref_counting>(1);
          new_empty->child[0] = empty;
          empty = new_empty;
          }
        // this root node must be one larger, otherwise segfault        
        *to_set = empty;
        return &leaf->child[0];
        }
      else
        {
        return to_set;
        }
      }